

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O0

void __thiscall
wasm::UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_>::push
          (UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this,
          pair<wasm::Name,_wasm::Name> item)

{
  mapped_type *pmVar1;
  UniqueDeferredQueue<std::pair<wasm::Name,_wasm::Name>_> *this_local;
  
  std::
  queue<std::pair<wasm::Name,_wasm::Name>,_std::deque<std::pair<wasm::Name,_wasm::Name>,_std::allocator<std::pair<wasm::Name,_wasm::Name>_>_>_>
  ::push(&this->data,&item);
  pmVar1 = std::
           unordered_map<std::pair<wasm::Name,_wasm::Name>,_unsigned_long,_std::hash<std::pair<wasm::Name,_wasm::Name>_>,_std::equal_to<std::pair<wasm::Name,_wasm::Name>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Name>,_unsigned_long>_>_>
           ::operator[](&this->count,&item);
  *pmVar1 = *pmVar1 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }